

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.h
# Opt level: O0

bool __thiscall
flatbuffers::BinaryAnnotator::IsValidUnionValue(BinaryAnnotator *this,Field *field,uint8_t value)

{
  bool bVar1;
  Type *this_00;
  char *pcVar2;
  int __c;
  Field *__s;
  undefined1 local_1a;
  uint8_t value_local;
  Field *field_local;
  BinaryAnnotator *this_local;
  
  __s = field;
  bVar1 = IsUnionType(this,field);
  local_1a = false;
  if (bVar1) {
    this_00 = reflection::Field::type(field);
    pcVar2 = reflection::Type::index(this_00,(char *)__s,__c);
    local_1a = IsValidUnionValue(this,(uint32_t)pcVar2,value);
  }
  return local_1a;
}

Assistant:

bool IsValidUnionValue(const reflection::Field *const field,
                         const uint8_t value) {
    return IsUnionType(field) &&
           IsValidUnionValue(field->type()->index(), value);
  }